

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O1

error_t ArgumentHandlers::jpolIndex_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  error_t eVar2;
  ulonglong uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  char *left;
  stringstream ss;
  char *local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  eVar2 = 7;
  if (jpolIndex_parse_argument(int,char*,argp_state*)::got_jpolIndex == '\0') {
    if (key == 0) {
      pvVar1 = state->input;
      uVar3 = strtoull(arg,&local_1b0,10);
      *(ulonglong *)((long)pvVar1 + 0x88) = uVar3;
      if (*local_1b0 != '\0') {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198,"Could not entirely parse the JPOL-INDEX: arg=\'",0x2e);
        poVar4 = std::operator<<(local_198,arg);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\', left=\'",9);
        poVar4 = std::operator<<(poVar4,local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\', found jpol index=\'",0x15);
        poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar5 = &PTR__E_0059bd80;
        std::__cxx11::stringbuf::str();
        __cxa_throw(puVar5,&E::typeinfo,E::~E);
      }
      jpolIndex_parse_argument(int,char*,argp_state*)::got_jpolIndex = '\x01';
    }
    else {
      if (key != 0x1000002) {
        return 7;
      }
      argp_usage(state);
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

error_t
jpolIndex_parse_argument (int key, char *arg, struct argp_state *state)
{
    static bool got_jpolIndex = 0;
    //if we already got the dec-pomdp file return
    if(got_jpolIndex)
        return ARGP_ERR_UNKNOWN;
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
        case ARGP_KEY_NO_ARGS:
            argp_usage (state);
            break;
        case ARGP_KEY_ARG:
        {
            char *left;
#if USE_ARBITRARY_PRECISION_INDEX
            theArgumentsStruc->jpolIndex = arg;
#else
            theArgumentsStruc->jpolIndex = strtoull(arg,&left,10);
            if(*left != '\0')
            {
                std::stringstream ss;
                ss << "Could not entirely parse the JPOL-INDEX: arg='"
                   << arg <<"', left='" << left
                   << "', found jpol index='"<< theArgumentsStruc->jpolIndex
                   << "'";
                throw(E(ss));
            }
#endif
            got_jpolIndex = 1;
            break;
        }
        default:
            return ARGP_ERR_UNKNOWN;
     }
    return 0;
}